

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  cmMakefile *pcVar1;
  cmTargetInternals *pcVar2;
  cmGeneratorExpression cVar3;
  bool bVar4;
  cmCompiledGeneratorExpression *x;
  cmCompiledGeneratorExpression *pcVar5;
  ostream *poVar6;
  auto_ptr<cmCompiledGeneratorExpression> *this_00;
  cmGeneratorExpression *this_01;
  ostringstream *this_02;
  cmCompiledGeneratorExpression *x_4;
  cmGeneratorExpression local_220;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> local_1e8;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  auto_ptr<cmCompiledGeneratorExpression> local_1c0;
  auto_ptr<cmCompiledGeneratorExpression> local_1b8;
  auto_ptr<cmCompiledGeneratorExpression> local_1b0;
  auto_ptr<cmCompiledGeneratorExpression> local_1a8;
  ostringstream e;
  
  if ((this->TargetTypeValue == INTERFACE_LIBRARY) &&
     (bVar4 = whiteListedInterfaceProperty(prop), !bVar4)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar6 = std::operator<<((ostream *)&e,
                             "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                            );
    poVar6 = std::operator<<(poVar6,(string *)prop);
    std::operator<<(poVar6,"\" is not allowed.");
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&ge);
LAB_00313c51:
    std::__cxx11::string::~string((string *)&ge);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    return;
  }
  bVar4 = std::operator==(prop,"NAME");
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::operator<<((ostream *)&e,"NAME property is read-only\n");
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&ge);
    goto LAB_00313c51;
  }
  bVar4 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  if (bVar4) {
    cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
    cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&e);
    pcVar2 = (this->Internal).Pointer;
    pcVar5 = (cmCompiledGeneratorExpression *)operator_new(0x10);
    cmGeneratorExpression::Parse(&local_220,(char *)&ge);
    cVar3.Backtrace = local_220.Backtrace;
    local_220.Backtrace = (cmListFileBacktrace *)0x0;
    local_1a8.x_ = (cmCompiledGeneratorExpression *)0x0;
    (pcVar5->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)cVar3.Backtrace;
    (pcVar5->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
    cge.x_ = pcVar5;
    std::
    vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
    ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
              ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                *)&pcVar2->IncludeDirectoriesEntries,(TargetPropertyEntry **)&cge);
    this_00 = &local_1a8;
LAB_00313e48:
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(this_00);
    this_01 = &local_220;
  }
  else {
    bVar4 = std::operator==(prop,"COMPILE_OPTIONS");
    if (bVar4) {
      cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
      cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&e);
      pcVar2 = (this->Internal).Pointer;
      pcVar5 = (cmCompiledGeneratorExpression *)operator_new(0x10);
      cmGeneratorExpression::Parse(&local_220,(char *)&ge);
      cVar3.Backtrace = local_220.Backtrace;
      local_220.Backtrace = (cmListFileBacktrace *)0x0;
      local_1b0.x_ = (cmCompiledGeneratorExpression *)0x0;
      (pcVar5->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)cVar3.Backtrace;
      (pcVar5->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
      cge.x_ = pcVar5;
      std::
      vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
      ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
                ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                  *)&pcVar2->CompileOptionsEntries,(TargetPropertyEntry **)&cge);
      this_00 = &local_1b0;
      goto LAB_00313e48;
    }
    bVar4 = std::operator==(prop,"COMPILE_FEATURES");
    if (bVar4) {
      cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
      cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&e);
      pcVar2 = (this->Internal).Pointer;
      pcVar5 = (cmCompiledGeneratorExpression *)operator_new(0x10);
      cmGeneratorExpression::Parse(&local_220,(char *)&ge);
      cVar3.Backtrace = local_220.Backtrace;
      local_220.Backtrace = (cmListFileBacktrace *)0x0;
      local_1b8.x_ = (cmCompiledGeneratorExpression *)0x0;
      (pcVar5->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)cVar3.Backtrace;
      (pcVar5->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
      cge.x_ = pcVar5;
      std::
      vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
      ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
                ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                  *)&pcVar2->CompileFeaturesEntries,(TargetPropertyEntry **)&cge);
      this_00 = &local_1b8;
      goto LAB_00313e48;
    }
    bVar4 = std::operator==(prop,"COMPILE_DEFINITIONS");
    if (bVar4) {
      cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
      cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&e);
      pcVar2 = (this->Internal).Pointer;
      pcVar5 = (cmCompiledGeneratorExpression *)operator_new(0x10);
      cmGeneratorExpression::Parse(&local_220,(char *)&ge);
      cVar3.Backtrace = local_220.Backtrace;
      local_220.Backtrace = (cmListFileBacktrace *)0x0;
      local_1c0.x_ = (cmCompiledGeneratorExpression *)0x0;
      (pcVar5->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)cVar3.Backtrace;
      (pcVar5->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
      cge.x_ = pcVar5;
      std::
      vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
      ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
                ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                  *)&pcVar2->CompileDefinitionsEntries,(TargetPropertyEntry **)&cge);
      this_00 = &local_1c0;
      goto LAB_00313e48;
    }
    bVar4 = std::operator==(prop,"EXPORT_NAME");
    if ((bVar4) && (this->IsImportedTarget == true)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar6 = std::operator<<((ostream *)&e,
                               "EXPORT_NAME property can\'t be set on imported targets (\"");
      poVar6 = std::operator<<(poVar6,(string *)&this->Name);
      std::operator<<(poVar6,"\")\n");
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&ge);
      goto LAB_00313c51;
    }
    bVar4 = std::operator==(prop,"LINK_LIBRARIES");
    if (bVar4) {
      cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge,this->Makefile);
      std::__cxx11::string::string((string *)&cge,value,(allocator *)&local_220);
      cmValueWithOrigin::cmValueWithOrigin
                ((cmValueWithOrigin *)&e,(string *)&cge,(cmListFileBacktrace *)&ge);
      std::__cxx11::string::~string((string *)&cge);
      std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
                (&((this->Internal).Pointer)->LinkImplementationPropertyEntries,(value_type *)&e);
      cmValueWithOrigin::~cmValueWithOrigin((cmValueWithOrigin *)&e);
      this_02 = (ostringstream *)&ge;
      goto LAB_00313e69;
    }
    bVar4 = std::operator==(prop,"SOURCES");
    if (!bVar4) {
      cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
      MaybeInvalidatePropertyCache(this,prop);
      return;
    }
    if (this->IsImportedTarget == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar6 = std::operator<<((ostream *)&e,
                               "SOURCES property can\'t be set on imported targets (\"");
      poVar6 = std::operator<<(poVar6,(string *)&this->Name);
      std::operator<<(poVar6,"\")\n");
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&ge);
      goto LAB_00313c51;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
    ::clear(&(((this->Internal).Pointer)->SourceFilesMap)._M_t);
    cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
    cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&e);
    cmGeneratorExpression::Parse(&local_220,(char *)&ge);
    cVar3.Backtrace = local_220.Backtrace;
    local_220.Backtrace = (cmListFileBacktrace *)0x0;
    cge.x_ = (cmCompiledGeneratorExpression *)cVar3.Backtrace;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_220);
    pcVar2 = (this->Internal).Pointer;
    local_220.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
    cge.x_ = (cmCompiledGeneratorExpression *)0x0;
    local_1e8.x_ = (cmCompiledGeneratorExpression *)0x0;
    (((cmCompiledGeneratorExpression *)local_220.Backtrace)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)cVar3.Backtrace;
    (((cmCompiledGeneratorExpression *)local_220.Backtrace)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
    std::
    vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
    ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
              ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                *)&pcVar2->SourceEntries,(TargetPropertyEntry **)&local_220);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_1e8);
    this_01 = (cmGeneratorExpression *)&cge;
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)this_01);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  this_02 = &e;
LAB_00313e69:
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)this_02);
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (this->GetType() == INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if (prop == "NAME")
    {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if(prop == "INCLUDE_DIRECTORIES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->IncludeDirectoriesEntries.push_back(
              new cmTargetInternals::TargetPropertyEntry(ge.Parse(value)));
    }
  else if(prop == "COMPILE_OPTIONS")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->CompileOptionsEntries.push_back(
              new cmTargetInternals::TargetPropertyEntry(ge.Parse(value)));
    }
  else if(prop == "COMPILE_FEATURES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->CompileFeaturesEntries.push_back(
              new cmTargetInternals::TargetPropertyEntry(ge.Parse(value)));
    }
  else if(prop == "COMPILE_DEFINITIONS")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->CompileDefinitionsEntries.push_back(
              new cmTargetInternals::TargetPropertyEntry(ge.Parse(value)));
    }
  else if(prop == "EXPORT_NAME" && this->IsImported())
    {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
          << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  else if (prop == "LINK_LIBRARIES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmValueWithOrigin entry(value, lfbt);
    this->Internal->LinkImplementationPropertyEntries.push_back(entry);
    }
  else if (prop == "SOURCES")
    {
    if(this->IsImported())
      {
      std::ostringstream e;
      e << "SOURCES property can't be set on imported targets (\""
            << this->Name << "\")\n";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
      this->Internal->SourceFilesMap.clear();
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      cmGeneratorExpression ge(&lfbt);
      cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
      this->Internal->SourceEntries.push_back(
                            new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else
    {
    this->Properties.AppendProperty(prop, value, asString);
    this->MaybeInvalidatePropertyCache(prop);
    }
}